

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

void __thiscall leveldb::Block::Iter::CorruptionError(Iter *this)

{
  Slice local_38;
  Slice local_28;
  Status local_18;
  Iter *local_10;
  Iter *this_local;
  
  this->current_ = this->restarts_;
  this->restart_index_ = this->num_restarts_;
  local_10 = this;
  Slice::Slice(&local_28,"bad entry in block");
  Slice::Slice(&local_38);
  Status::Corruption(&local_18,&local_28,&local_38);
  Status::operator=(&this->status_,&local_18);
  Status::~Status(&local_18);
  std::__cxx11::string::clear();
  Slice::clear(&this->value_);
  return;
}

Assistant:

void CorruptionError() {
    current_ = restarts_;
    restart_index_ = num_restarts_;
    status_ = Status::Corruption("bad entry in block");
    key_.clear();
    value_.clear();
  }